

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int ffedit_columns(fitsfile **fptr,char *outfile,char *expr,int *status)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  fitsfile *pfVar12;
  long lVar13;
  ulong uVar14;
  int colnum;
  char *file_expr;
  char *clause;
  int tstatus;
  char *tstbuff;
  int testnum;
  int numcols;
  int hdunum;
  int status_del;
  char *cptr3;
  fitsfile *newptr;
  char colname [71];
  char oldname [71];
  char colformat [71];
  char testname [71];
  char keyname [75];
  char card [81];
  void *local_288;
  int local_27c;
  char *local_278;
  char *local_270;
  int local_264;
  char *local_260;
  int local_254;
  int local_250;
  uint local_24c;
  char *local_248;
  int local_240;
  int local_23c;
  char *local_238;
  int local_22c;
  char *local_228;
  undefined8 local_220;
  char local_218 [72];
  size_t local_1d0;
  char local_1c8 [80];
  char local_178 [79];
  char acStack_129 [81];
  char local_d8 [80];
  char local_88 [88];
  
  local_27c = -1;
  local_24c = 0;
  local_264 = 0;
  local_260 = (char *)0x0;
  local_270 = (char *)0x0;
  local_278 = (char *)0x0;
  if (*outfile != '\0') {
    iVar5 = ffinit((fitsfile **)&local_220,outfile,status);
    if (iVar5 < 1) {
      ffghdn(*fptr,&local_23c);
      iVar5 = (*fptr)->Fptr->only_one;
      iVar6 = ffmahd(*fptr,1,(int *)0x0,status);
      pfVar12 = local_220;
      if (iVar5 == 0) {
        if (iVar6 < 1) {
          iVar5 = 2;
          do {
            ffcopy(*fptr,pfVar12,0,status);
            iVar6 = ffmahd(*fptr,iVar5,(int *)0x0,status);
            iVar5 = iVar5 + 1;
          } while (iVar6 < 1);
        }
        pfVar12 = local_220;
        if (*status == 0x6b) {
          *status = 0;
        }
        else if (0 < *status) goto LAB_0011a546;
      }
      else {
        ffcopy(*fptr,local_220,0,status);
        ffmahd(*fptr,local_23c,(int *)0x0,status);
        ffcopy(*fptr,local_220,0,status);
        if (0 < *status) {
LAB_0011a546:
          ffclos(local_220,status);
          pcVar10 = "failed to copy all HDUs from input file (ffedit_columns)";
          goto LAB_0011a584;
        }
        local_23c = 2;
      }
      ffclos(*fptr,status);
      *fptr = pfVar12;
      iVar5 = ffmahd(pfVar12,local_23c,(int *)0x0,status);
      if (iVar5 < 1) goto LAB_0011a59d;
      pcVar10 = "failed to copy the input file (ffedit_columns)";
    }
    else {
      pcVar10 = "failed to create file for copy (ffedit_columns)";
    }
LAB_0011a584:
    ffpmsg(pcVar10);
    goto LAB_0011a589;
  }
LAB_0011a59d:
  for (pcVar10 = expr + 4; *pcVar10 == ' '; pcVar10 = pcVar10 + 1) {
  }
  if (*pcVar10 == '@') {
    local_238 = pcVar10;
    iVar5 = ffimport_file(pcVar10 + 1,&local_278,status);
    if (iVar5 != 0) goto LAB_0011a589;
    pcVar11 = local_278 + -1;
    do {
      pcVar10 = pcVar11 + 1;
      pcVar9 = pcVar11 + 1;
      pcVar11 = pcVar10;
    } while (*pcVar9 == ' ');
  }
  local_264 = 0;
  local_238 = pcVar10;
  ffgncl(*fptr,(int *)&local_24c,&local_264);
  iVar5 = comma2semicolon(pcVar10);
  if (iVar5 != 0) {
    ffpmsg("parsing error in column filter expression");
    ffpmsg(pcVar10);
    if (local_278 != (char *)0x0) {
      free(local_278);
    }
    *status = 0x1af;
    return 0x1af;
  }
  uVar7 = fits_get_token2(&local_238,";",&local_270,(int *)0x0,status);
  if (0 < (int)uVar7) {
    local_288 = (void *)0x0;
    local_250 = 0;
    local_240 = 0;
    do {
      pcVar11 = local_270;
      pcVar10 = local_218;
      if (*local_238 == ';') {
        local_238 = local_238 + 1;
      }
      local_270[uVar7] = '\0';
      if ((*local_270 != '-') && (*local_270 != '!')) {
        local_248 = local_270;
        iVar5 = fits_get_token2(&local_248,"( =",&local_260,(int *)0x0,status);
        pcVar9 = local_260;
        if ((iVar5 == 0) || (*status != 0)) {
          ffpmsg("error: column or keyword name is blank (ffedit_columns):");
          ffpmsg(pcVar11);
          if (local_288 != (void *)0x0) {
            free(local_288);
          }
          if (local_278 != (char *)0x0) {
            free(local_278);
          }
          if (local_270 != (char *)0x0) {
            free(local_270);
          }
          if (*status != 0) {
            return *status;
          }
          goto LAB_0011b18c;
        }
        sVar8 = strlen(local_260);
        if (sVar8 < 0x47) {
          strcpy(pcVar10,pcVar9);
          free(pcVar9);
          local_260 = (char *)0x0;
          if (local_218[0] == '#') {
            pcVar9 = strchr(local_218 + 1,0x23);
            sVar8 = strlen(pcVar10);
            if (pcVar9 != local_218 + (sVar8 - 1)) goto LAB_0011a807;
            if (0 < local_27c) {
              pcVar10[sVar8 - 1] = '\0';
              pcVar10 = local_218 + 1;
              ffkeyn(pcVar10,local_27c,local_1c8,status);
              if (*status != 0) {
                return *status;
              }
LAB_0011aa90:
              strcpy(pcVar10,local_1c8);
              goto LAB_0011aa9d;
            }
            ffpmsg("The keyword name:");
            ffpmsg(local_218);
            ffpmsg("is invalid unless a column has been previously");
            ffpmsg("created or editted by a calculator command");
            if (local_278 != (char *)0x0) {
              free(local_278);
            }
          }
          else {
LAB_0011a807:
            pcVar9 = strchr(pcVar10,0x23);
            sVar8 = strlen(pcVar10);
            if ((pcVar9 == local_218 + (sVar8 - 1)) && (0 < local_27c)) {
              local_264 = 0;
              ffgcno(*fptr,0,pcVar10,&local_254,&local_264);
              if ((local_264 != 0) && (local_264 != 0xed)) {
                ffcmsg();
                pcVar9 = acStack_129 + 1;
                strcpy(pcVar9,pcVar10);
                sVar8 = strlen(pcVar9);
                pcVar9[sVar8 - 1] = '\0';
                ffkeyn(pcVar9,local_27c,local_1c8,status);
                if (*status != 0) {
                  if (local_278 != (char *)0x0) {
                    free(local_278);
                  }
                  goto LAB_0011b1dd;
                }
                local_264 = 0;
                iVar5 = ffgcrd(*fptr,local_1c8,local_88,&local_264);
                if (iVar5 == 0) goto LAB_0011aa90;
              }
            }
LAB_0011aa9d:
            if (*local_248 != '(') {
LAB_0011ab45:
              do {
                pcVar9 = local_248;
                pcVar10 = pcVar9 + 1;
                local_248 = pcVar10;
              } while (*pcVar9 == ' ');
              if (*pcVar9 == '=') {
                if (*pcVar10 == '=') {
                  pcVar10 = pcVar9 + 2;
                  do {
                    local_248 = pcVar10;
                    pcVar10 = local_248 + 1;
                  } while (*local_248 == ' ');
                  iVar5 = fits_get_token2(&local_248," ",&local_260,(int *)0x0,status);
                  pcVar10 = local_260;
                  if (iVar5 == 0) {
                    local_1c8[0] = '\0';
                  }
                  else {
                    sVar8 = strlen(local_260);
                    if (0x46 < sVar8) {
                      pcVar9 = "error: column name syntax is too long (ffedit_columns):";
                      goto LAB_0011b168;
                    }
                    strcpy(local_1c8,pcVar10);
                    free(pcVar10);
                    local_260 = (char *)0x0;
                  }
                  iVar5 = ffgcno(*fptr,0,local_1c8,&local_27c,status);
                  if (iVar5 < 1) {
                    ffkeyn("TTYPE",local_27c,local_d8,status);
                    iVar5 = ffmkys(*fptr,local_d8,local_218,(char *)0x0,status);
                    if (0 < iVar5) {
                      ffpmsg("failed to rename column in input file");
                      ffpmsg(" oldname =");
                      ffpmsg(local_1c8);
                      ffpmsg(" newname =");
                      pcVar11 = local_218;
                      goto LAB_0011b1ab;
                    }
                    if (local_288 == (void *)0x0) {
                      local_288 = calloc(999,4);
                    }
                    *(undefined4 *)((long)local_288 + (long)local_27c * 4 + -4) = 1;
                    local_250 = 1;
                  }
                  else {
                    ffcmsg();
                    *status = 0;
                    iVar5 = ffmnam(*fptr,local_1c8,local_218,status);
                    if (0 < iVar5) {
                      pcVar10 = "column or keyword to be renamed does not exist:";
                      goto LAB_0011b1a3;
                    }
                  }
                  goto LAB_0011aa14;
                }
                local_178[0] = '\0';
                local_228 = local_218;
                iVar5 = fits_get_token2(&local_228,"(",&local_260,(int *)0x0,status);
                pcVar11 = local_260;
                if (iVar5 == 0) {
                  local_1c8[0] = '\0';
LAB_0011ad97:
                  if (*local_228 == '(') {
                    local_228 = local_228 + 1;
                    iVar5 = fits_get_token2(&local_228,")",&local_260,(int *)0x0,status);
                    pcVar11 = local_260;
                    if (iVar5 == 0) {
                      local_178[0] = '\0';
                    }
                    else {
                      sVar8 = strlen(local_260);
                      if (0x46 < sVar8) goto LAB_0011b113;
                      strcpy(local_178,pcVar11);
                      free(pcVar11);
                      local_260 = (char *)0x0;
                    }
                  }
                  iVar5 = ffcalc(*fptr,pcVar10,*fptr,local_1c8,local_178,status);
                  if (0 < iVar5) {
                    pcVar11 = "Unable to calculate expression";
                    goto LAB_0011b1ab;
                  }
                  local_264 = 0;
                  ffgcno(*fptr,0,local_1c8,&local_254,&local_264);
                  if (local_264 == 0) {
                    lVar13 = (long)local_254;
                    local_27c = local_254;
                    if (local_288 == (void *)0x0) {
                      local_288 = calloc(999,4);
                    }
                    *(undefined4 *)((long)local_288 + lVar13 * 4 + -4) = 1;
                    local_250 = 1;
                    if ((int)local_24c < local_27c) {
                      local_24c = local_24c + 1;
                    }
                  }
                  else {
                    ffcmsg();
                  }
                  goto LAB_0011aa14;
                }
                sVar8 = strlen(local_260);
                if (sVar8 < 0x47) {
                  strcpy(local_1c8,pcVar11);
                  free(pcVar11);
                  local_260 = (char *)0x0;
                  goto LAB_0011ad97;
                }
LAB_0011b113:
                pcVar11 = "column expression is too long (ffedit_columns)";
                goto LAB_0011b058;
              }
              local_248 = pcVar9;
              ffgcno(*fptr,0,local_218,&local_254,status);
              iVar5 = *status;
              if (iVar5 == 0xed) {
                do {
                  lVar13 = (long)local_254;
                  local_27c = local_254;
                  if (local_288 == (void *)0x0) {
                    local_288 = calloc(999,4);
                  }
                  *(undefined4 *)((long)local_288 + lVar13 * 4 + -4) = 1;
                  ffgcno(*fptr,0,local_218,&local_254,status);
                  iVar5 = *status;
                } while (iVar5 == 0xed);
                if (iVar5 != 0xdb) {
                  local_250 = 1;
                  goto LAB_0011ace1;
                }
                local_250 = 1;
              }
              else {
LAB_0011ace1:
                if (iVar5 < 1) {
                  lVar13 = (long)local_254;
                  local_27c = local_254;
                  if (local_288 == (void *)0x0) {
                    local_288 = calloc(999,4);
                  }
                  *(undefined4 *)((long)local_288 + lVar13 * 4 + -4) = 1;
                  local_250 = 1;
                  goto LAB_0011aa14;
                }
                if (iVar5 != 999) {
                  ffpmsg("Syntax error in columns specifier in input URL:");
                  ffpmsg(pcVar9);
                  if (local_288 != (void *)0x0) {
                    free(local_288);
                  }
                  if (local_278 != (char *)0x0) {
                    free(local_278);
                  }
                  pcVar11 = local_270;
                  if (local_270 == (char *)0x0) goto LAB_0011b18c;
                  goto LAB_0011b187;
                }
              }
              *status = 0;
              goto LAB_0011aa14;
            }
            iVar5 = fits_get_token2(&local_248,")",&local_260,(int *)0x0,status);
            pcVar10 = local_260;
            if (iVar5 == 0) {
              sVar8 = strlen(local_218);
              (local_218 + sVar8)[0] = ')';
              (local_218 + sVar8)[1] = '\0';
LAB_0011ab3d:
              local_248 = local_248 + 1;
              goto LAB_0011ab45;
            }
            local_1d0 = strlen(local_260);
            sVar8 = strlen(local_218);
            if (0xffffffffffffffb8 < (sVar8 + local_1d0) - 0x46) {
              strcat(local_218,pcVar10);
              sVar8 = strlen(local_218);
              (local_218 + sVar8)[0] = ')';
              (local_218 + sVar8)[1] = '\0';
              free(pcVar10);
              local_260 = (char *)0x0;
              goto LAB_0011ab3d;
            }
            pcVar9 = "error: column name is too long (ffedit_columns):";
LAB_0011b168:
            ffpmsg(pcVar9);
            if (local_278 != (char *)0x0) {
              free(local_278);
            }
            free(pcVar11);
            pcVar11 = pcVar10;
          }
        }
        else {
          ffpmsg("error: column or keyword name is too long (ffedit_columns):");
LAB_0011b058:
          ffpmsg(pcVar11);
          if (local_288 != (void *)0x0) {
            free(local_288);
          }
          if (local_278 != (char *)0x0) {
            free(local_278);
          }
          pcVar11 = local_260;
          if (local_270 != (char *)0x0) {
            free(local_270);
            pcVar11 = local_260;
          }
        }
LAB_0011b187:
        free(pcVar11);
LAB_0011b18c:
        *status = 0x7d;
        return 0x7d;
      }
      pcVar10 = local_270 + 1;
      cVar2 = local_270[1];
      if (cVar2 == '\0') {
LAB_0011a94f:
        ffcmsg();
        *status = 0;
        pcVar9 = pcVar11 + 2;
        pcVar1 = pcVar11 + 1;
        pcVar11 = pcVar10;
        if (*pcVar1 == '#') {
          pcVar11 = pcVar9;
        }
        sVar8 = strlen(pcVar11);
        bVar3 = true;
        if ((1 < (int)sVar8) && (uVar7 = (int)sVar8 - 1, pcVar11[uVar7] == '+')) {
          pcVar11[uVar7] = '\0';
          bVar3 = false;
        }
        pcVar10 = strchr(pcVar11,0x3f);
        if (((pcVar10 != (char *)0x0) || (pcVar10 = strchr(pcVar11,0x2a), pcVar10 != (char *)0x0))
           || (pcVar10 = strchr(pcVar11,0x23), pcVar10 != (char *)0x0)) {
          ffmaky(*fptr,1,status);
        }
        do {
          iVar5 = ffdkey(*fptr,pcVar11,status);
          if (0 < iVar5) {
            if ((bVar3) || (*status != 0xca)) {
              ffpmsg("column or keyword to be deleted does not exist:");
              goto LAB_0011b1ab;
            }
            ffcmsg();
            *status = 0;
            break;
          }
          bVar4 = !bVar3;
          bVar3 = false;
        } while (bVar4);
      }
      else {
        sVar8 = strlen(pcVar10);
        if ((*status != 0) || ((int)(uint)sVar8 < 2)) {
LAB_0011a8ed:
          if ((cVar2 == '#') ||
             ((iVar5 = ffgcno(*fptr,0,pcVar10,&local_27c,status), 0 < iVar5 && (*status != 0xed))))
          goto LAB_0011a94f;
          *status = 0;
          iVar5 = ffdcol(*fptr,local_27c,status);
          if (iVar5 < 1) {
            local_24c = local_24c - 1;
            local_27c = -1;
            local_240 = 1;
            goto LAB_0011aa14;
          }
          pcVar10 = "failed to delete column in input file:";
LAB_0011b1a3:
          ffpmsg(pcVar10);
LAB_0011b1ab:
          ffpmsg(pcVar11);
          goto LAB_0011b1b0;
        }
        if (cVar2 == '#') goto LAB_0011a94f;
        uVar7 = (uint)sVar8 & 0x7fffffff;
        if (pcVar11[uVar7] != '+') goto LAB_0011a8ed;
        pcVar11[uVar7] = '\0';
        do {
          local_22c = 0;
          *status = 0;
          ffgcno(*fptr,0,pcVar10,&local_27c,status);
          if ((*status != 0xed) && (*status != 0)) break;
          iVar5 = ffdcol(*fptr,local_27c,&local_22c);
          if (0 < iVar5) {
            ffpmsg("failed to delete column in input file:");
            ffpmsg(pcVar11);
            if (local_288 != (void *)0x0) {
              free(local_288);
            }
            if (local_278 != (char *)0x0) {
              free(local_278);
            }
            if (local_270 != (char *)0x0) {
              free(local_270);
            }
            *status = local_22c;
            return local_22c;
          }
          local_24c = local_24c - 1;
          local_240 = 1;
        } while (*status == 0xed);
        *status = 0;
        local_27c = -1;
      }
LAB_0011aa14:
      if (local_270 != (char *)0x0) {
        free(local_270);
      }
      local_270 = (char *)0x0;
      uVar7 = fits_get_token2(&local_238,";",&local_270,(int *)0x0,status);
    } while (0 < (int)uVar7);
    if ((int)local_24c < 1 || (local_240 != 0 || local_250 == 0)) {
LAB_0011b1b0:
      if (local_288 == (void *)0x0) goto LAB_0011b1c0;
    }
    else {
      uVar14 = (ulong)local_24c;
      do {
        if ((*(int *)((long)local_288 + uVar14 * 4 + -4) == 0) &&
           (iVar5 = ffdcol(*fptr,(int)uVar14,status), 0 < iVar5)) {
          ffpmsg("failed to delete column in input file:");
          ffpmsg(local_270);
          break;
        }
        bVar3 = 1 < uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar3);
    }
    free(local_288);
  }
LAB_0011b1c0:
  if (local_278 != (char *)0x0) {
    free(local_278);
  }
  pcVar11 = local_270;
  if (local_270 != (char *)0x0) {
LAB_0011b1dd:
    free(pcVar11);
  }
LAB_0011a589:
  return *status;
}

Assistant:

int ffedit_columns(
           fitsfile **fptr,  /* IO - pointer to input table; on output it  */
                             /*      points to the new selected rows table */
           char *outfile,    /* I - name for output file */
           char *expr,       /* I - column edit expression    */
           int *status)
/*
   modify columns in a table and/or header keywords in the HDU
*/
{
    fitsfile *newptr;
    int ii, hdunum, slen, colnum = -1, testnum, deletecol = 0, savecol = 0;
    int numcols = 0, *colindex = 0, tstatus = 0;
    char *tstbuff=0, *cptr, *cptr2, *cptr3, *clause = NULL, keyname[FLEN_KEYWORD];
    char colname[FLEN_VALUE], oldname[FLEN_VALUE], colformat[FLEN_VALUE];
    char *file_expr = NULL, testname[FLEN_VALUE], card[FLEN_CARD];

    if (*outfile)
    {
      /* create new empty file in to hold the selected rows */
      if (ffinit(&newptr, outfile, status) > 0)
      {
        ffpmsg("failed to create file for copy (ffedit_columns)");
        return(*status);
      }

      fits_get_hdu_num(*fptr, &hdunum);  /* current HDU number in input file */

      /* copy all HDUs to the output copy, if the 'only_one' flag is not set */
      if (!((*fptr)->Fptr)->only_one) {
        for (ii = 1; 1; ii++)
        {
          if (fits_movabs_hdu(*fptr, ii, NULL, status) > 0)
            break;

          fits_copy_hdu(*fptr, newptr, 0, status);
        }

        if (*status == END_OF_FILE)
        {
          *status = 0;              /* got the expected EOF error; reset = 0  */
        }
        else if (*status > 0)
        {
          ffclos(newptr, status);
          ffpmsg("failed to copy all HDUs from input file (ffedit_columns)");
          return(*status);
        }


      } else {
        /* only copy the primary array and the designated table extension */
	fits_movabs_hdu(*fptr, 1, NULL, status);
	fits_copy_hdu(*fptr, newptr, 0, status);
	fits_movabs_hdu(*fptr, hdunum, NULL, status);
	fits_copy_hdu(*fptr, newptr, 0, status);
        if (*status > 0)
        {
          ffclos(newptr, status);
          ffpmsg("failed to copy all HDUs from input file (ffedit_columns)");
          return(*status);
        }
        hdunum = 2;
      }

      /* close the original file and return ptr to the new image */
      ffclos(*fptr, status);

      *fptr = newptr; /* reset the pointer to the new table */

      /* move back to the selected table HDU */
      if (fits_movabs_hdu(*fptr, hdunum, NULL, status) > 0)
      {
         ffpmsg("failed to copy the input file (ffedit_columns)");
         return(*status);
      }
    }

    /* remove the "col " from the beginning of the column edit expression */
    cptr = expr + 4;

    while (*cptr == ' ')
         cptr++;         /* skip leading white space */
   
    /* Check if need to import expression from a file */

    if( *cptr=='@' ) {
       if( ffimport_file( cptr+1, &file_expr, status ) ) return(*status);
       cptr = file_expr;
       while (*cptr == ' ')
          cptr++;         /* skip leading white space... again */
    }

    tstatus = 0;
    ffgncl(*fptr, &numcols, &tstatus);  /* get initial # of cols */

    /* as of July 2012, the CFITSIO column filter syntax was modified */
    /* so that commas may be used to separate clauses, as well as semi-colons. */
    /* This was done because users cannot enter the semi-colon in the HEASARC's */
    /* Hera on-line data processing system for computer security reasons.  */
    /* Therefore, we must convert those commas back to semi-colons here, but we */
    /* must not convert any columns that occur within parenthesies.  */

    if (comma2semicolon(cptr)) {
         ffpmsg("parsing error in column filter expression");
         ffpmsg(cptr);
         if( file_expr ) free( file_expr );
         *status = PARSE_SYNTAX_ERR;
         return(*status);
    }

    /* parse expression and get first clause, if more than 1 */
    while ((slen = fits_get_token2(&cptr, ";", &clause, NULL, status)) > 0 )
    {
        if( *cptr==';' ) cptr++;
        clause[slen] = '\0';

        if (clause[0] == '!' || clause[0] == '-')
        {
	    char *clause1 = clause+1;
	    int clen = clause1[0] ? strlen(clause1) : 0;
            /* ===================================== */
            /* Case I. delete this column or keyword */
            /* ===================================== */

	    /* Case Ia. delete column names with 0-or-more wildcard
	            -COLNAME+ - delete repeated columns with exact name
		    -COLNAM*+ - delete columns matching patterns
	    */
	    if (*status == 0 &&
		clen > 1 && clause1[0] != '#' &&
		clause1[clen-1] == '+') {

	      clause1[clen-1] = 0; clen--;

	      /* Note that this is a delete 0 or more specification,
		 which means that no matching columns is not an error. */
	      do {
		int status_del = 0;

		/* Have to set status=0 so we can reset the search at
		   start column.  Because we are deleting columns on
		   the fly here, we have to reset the search every
		   time. The only penalty here is execution time
		   because leaving *status == COL_NOT_UNIQUE is merely
		   an optimization for tables assuming the tables do
		   not change from one call to the next. (an
		   assumption broken in this loop) */
		*status = 0; 
		ffgcno(*fptr, CASEINSEN, clause1, &colnum, status);
		/* ffgcno returns COL_NOT_UNIQUE if there are multiple columns,
		   and COL_NOT_FOUND after the last column is found, and 
		   COL_NOT_FOUND if no matches were found */
		if (*status != 0 && *status != COL_NOT_UNIQUE) break;
		
                if (ffdcol(*fptr, colnum, &status_del) > 0) {
		  ffpmsg("failed to delete column in input file:");
		  ffpmsg(clause);
		  if( colindex ) free( colindex );
		  if( file_expr ) free( file_expr );
		  if( clause ) free(clause);
		  return (*status = status_del);
		}
                deletecol = 1; /* set flag that at least one col was deleted */
                numcols--;
	      } while (*status == COL_NOT_UNIQUE);

	      *status = 0; /* No matches are still successful */
	      colnum = -1; /* Ignore the column we found */

	    /* Case Ib. delete column names with wildcard or not
	            -COLNAME  - deleted exact column
		    -COLNAM*  - delete first column that matches pattern
	       Note no leading '#'
	    */
	    } else if (clause1[0] && clause1[0] != '#' &&
		       ((ffgcno(*fptr, CASEINSEN, clause1, &colnum, status) <= 0) ||
			*status == COL_NOT_UNIQUE))
            {
                /* a column with this name exists, so try to delete it */
	        *status = 0; /* Clear potential status=COL_NOT_UNIQUE */
                if (ffdcol(*fptr, colnum, status) > 0)
                {
                    ffpmsg("failed to delete column in input file:");
                    ffpmsg(clause);
                    if( colindex ) free( colindex );
                    if( file_expr ) free( file_expr );
		    if( clause ) free(clause);
                    return(*status);
                }
                deletecol = 1; /* set flag that at least one col was deleted */
                numcols--;
                colnum = -1;
            }
	    /* Case Ic. delete keyword(s)
	            -KEYNAME,#KEYNAME  - delete exact keyword (first match)
		    -KEYNAM*,#KEYNAM*  - delete first matching keyword
		    -KEYNAME+,-#KEYNAME+ - delete 0-or-more exact matches of exact keyword
		    -KEYNAM*+,-#KEYNAM*+ - delete 0-or-more wildcard matches 
	       Note the preceding # is optional if no conflicting column name exists
	       and that wildcard patterns are described in "colfilter" section of
	       documentation.
	    */
            else
            {
	      int delall = 0;
	      int haswild = 0;
	        ffcmsg();   /* clear previous error message from ffgcno */
                /* try deleting a keyword with this name */
                *status = 0;
		/* skip past leading '#' if any */
		if (clause1[0] == '#') clause1++;
		clen = strlen(clause1);

		/* Repeat deletion of keyword if requested with trailing '+' */
		if (clen > 1 && clause1[clen-1] == '+') {
		  delall = 1;
		  clause1[clen-1] = 0;
		}
		/* Determine if this pattern has wildcards */
		if (strchr(clause1,'?') || strchr(clause1,'*') || strchr(clause1,'#')) {
		  haswild = 1;
		}

		if (haswild) {
		  /* ffdkey() behaves differently if the pattern has a wildcard:
		     it only checks from the "current" header position to the end, and doesn't
		     check before the "current" header position.  Therefore, for the
		     case of wildcards we will have to reset to the beginning. */
		  ffmaky(*fptr, 1, status);  /* reset pointer to beginning of header */
		}

		/* Single or repeated deletions until done */
		do {
		  if (ffdkey(*fptr, clause1, status) > 0)
		    {
		      if (delall && *status == KEY_NO_EXIST) {
			/* Found last wildcard item. Stop deleting */
			ffcmsg();
			*status = 0;
			delall = 0; /* Force end of this loop */
		      } else {
			/* This was not a wildcard deletion, or it resulted in
			   another kind of error */
			ffpmsg("column or keyword to be deleted does not exist:");
			ffpmsg(clause1);
			if( colindex ) free( colindex );
			if( file_expr ) free( file_expr );
			if( clause ) free(clause);
			return(*status);
		      }
		    }
		} while(delall); /* end do{} */
            }
        }
        else
        {
            /* ===================================================== */
            /* Case II:
	       this is either a column name, (case 1) 

               or a new column name followed by double = ("==") followed
               by the old name which is to be renamed. (case 2A)

               or a column or keyword name followed by a single "=" and a
	       calculation expression (case 2B) */
            /* ===================================================== */
            cptr2 = clause;
            slen = fits_get_token2(&cptr2, "( =", &tstbuff, NULL, status);

            if (slen == 0 || *status)
            {
                ffpmsg("error: column or keyword name is blank (ffedit_columns):");
                ffpmsg(clause);
                if( colindex ) free( colindex );
                if( file_expr ) free( file_expr );
		if (clause) free(clause);
                if (*status==0)
                   *status=URL_PARSE_ERROR;
                return(*status);
            }
            if (strlen(tstbuff) > FLEN_VALUE-1)
            {
                ffpmsg("error: column or keyword name is too long (ffedit_columns):");
                ffpmsg(clause);
                if( colindex ) free( colindex );
                if( file_expr ) free( file_expr );
		if (clause) free(clause);
                free(tstbuff);
                return(*status= URL_PARSE_ERROR);
            }
            strcpy(colname, tstbuff);
            free(tstbuff);
            tstbuff=0;

	    /* If this is a keyword of the form 
	         #KEYWORD# 
	       then transform to the form
	         #KEYWORDn
	       where n is the previously used column number 
	    */
	    if (colname[0] == '#' &&
		strstr(colname+1, "#") == (colname + strlen(colname) - 1)) 
	    {
		if (colnum <= 0) 
		  {
		    ffpmsg("The keyword name:");
		    ffpmsg(colname);
		    ffpmsg("is invalid unless a column has been previously");
		    ffpmsg("created or editted by a calculator command");
                    if( file_expr ) free( file_expr );
		    if (clause) free(clause);
		    return(*status = URL_PARSE_ERROR);
		  }
		colname[strlen(colname)-1] = '\0';
		/* Make keyword name and put it in oldname */
		ffkeyn(colname+1, colnum, oldname, status);
		if (*status) return (*status);
		/* Re-copy back into colname */
		strcpy(colname+1,oldname);
	    }
            else if  (strstr(colname, "#") == (colname + strlen(colname) - 1)) 
	    {
	        /*  colname is of the form "NAME#";  if
		      a) colnum is defined, and
		      b) a column with literal name "NAME#" does not exist, and
		      c) a keyword with name "NAMEn" (where n=colnum) exists, then
		    transfrom the colname string to "NAMEn", otherwise
		    do nothing.
		*/
		if (colnum > 0) {  /* colnum must be defined */
		  tstatus = 0;
                  ffgcno(*fptr, CASEINSEN, colname, &testnum, &tstatus);
		  if (tstatus != 0 && tstatus != COL_NOT_UNIQUE) 
		  {  
		    /* OK, column doesn't exist, now see if keyword exists */
		    ffcmsg();   /* clear previous error message from ffgcno */
		    strcpy(testname, colname);
 		    testname[strlen(testname)-1] = '\0';
		    /* Make keyword name and put it in oldname */
		    ffkeyn(testname, colnum, oldname, status);
		    if (*status) {
                      if( file_expr ) free( file_expr );
		      if (clause) free(clause);
		      return (*status);
		    }

		    tstatus = 0;
		    if (!fits_read_card(*fptr, oldname, card, &tstatus)) {
		      /* Keyword does exist; copy real name back into colname */
		      strcpy(colname,oldname);
		    }
		  }
                }
	    }

            /* if we encountered an opening parenthesis, then we need to */
            /* find the closing parenthesis, and concatinate the 2 strings */
            /* This supports expressions like:
                [col #EXTNAME(Extension name)="GTI"]
            */
            if (*cptr2  == '(')
            {
                if (fits_get_token2(&cptr2, ")", &tstbuff, NULL, status)==0)
                {
                   strcat(colname,")");
                }
                else
                {
                   if ((strlen(tstbuff) + strlen(colname) + 1) >
                        FLEN_VALUE-1)
                   {
                      ffpmsg("error: column name is too long (ffedit_columns):");
                      if( file_expr ) free( file_expr );
		      if (clause) free(clause);
                      free(tstbuff);
                      *status=URL_PARSE_ERROR;
		      return (*status);
                   }
                   strcat(colname, tstbuff);
                   strcat(colname, ")");
                   free(tstbuff);
                   tstbuff=0;
                }
                cptr2++;
            }

            while (*cptr2 == ' ')
                 cptr2++;         /* skip white space */

            if (*cptr2 != '=')
            {
              /* ------------------------------------ */
              /* case 1 - simply the name of a column */
              /* ------------------------------------ */

              /* look for matching column */
              ffgcno(*fptr, CASEINSEN, colname, &testnum, status);
	      
              while (*status == COL_NOT_UNIQUE) 
              {
                 /* the column name contained wild cards, and it */
                 /* matches more than one column in the table. */
		 
		 colnum = testnum;

                 /* keep this column in the output file */
                 savecol = 1;

                 if (!colindex)
                    colindex = (int *) calloc(999, sizeof(int));

                 colindex[colnum - 1] = 1;  /* flag this column number */

                 /* look for other matching column names */
                 ffgcno(*fptr, CASEINSEN, colname, &testnum, status);

                 if (*status == COL_NOT_FOUND)
                    *status = 999;  /* temporary status flag value */
              }

              if (*status <= 0)
              {
	         colnum = testnum;
		 
                 /* keep this column in the output file */
                 savecol = 1;

                 if (!colindex)
                    colindex = (int *) calloc(999, sizeof(int));

                 colindex[colnum - 1] = 1;  /* flag this column number */
              }
              else if (*status == 999)
              {
                  /* this special flag value does not represent an error */
                  *status = 0;  
              }
              else
              {
               ffpmsg("Syntax error in columns specifier in input URL:");
               ffpmsg(cptr2);
               if( colindex ) free( colindex );
               if( file_expr ) free( file_expr );
	       if (clause) free(clause);
               return(*status = URL_PARSE_ERROR);
              }
            }
            else
            {
              /* ----------------------------------------------- */
              /* case 2 where the token ends with an equals sign */
              /* ----------------------------------------------- */

              cptr2++;   /* skip over the first '=' */

              if (*cptr2 == '=')
              {
                /*................................................. */
                /*  Case A:  rename a column or keyword;  syntax is
                    "new_name == old_name"  */
                /*................................................. */

                cptr2++;  /* skip the 2nd '=' */
                while (*cptr2 == ' ')
                      cptr2++;       /* skip white space */

                if (fits_get_token2(&cptr2, " ", &tstbuff, NULL, status)==0)
                {
                   oldname[0]=0;
                }
                else
                {
                   if (strlen(tstbuff) > FLEN_VALUE-1)
                   {
                      ffpmsg("error: column name syntax is too long (ffedit_columns):");
                      if( file_expr ) free( file_expr );
		      if (clause) free(clause);
                      free(tstbuff);
                      *status=URL_PARSE_ERROR;
		      return (*status);
                   }
                   strcpy(oldname, tstbuff);
                   free(tstbuff);
                   tstbuff=0;
                }
                /* get column number of the existing column */
                if (ffgcno(*fptr, CASEINSEN, oldname, &colnum, status) <= 0)
                {
                    /* modify the TTYPEn keyword value with the new name */
                    ffkeyn("TTYPE", colnum, keyname, status);

                    if (ffmkys(*fptr, keyname, colname, NULL, status) > 0)
                    {
                      ffpmsg("failed to rename column in input file");
                      ffpmsg(" oldname =");
                      ffpmsg(oldname);
                      ffpmsg(" newname =");
                      ffpmsg(colname);
                      if( colindex ) free( colindex );
                      if( file_expr ) free( file_expr );
	              if (clause) free(clause);
                      return(*status);
                    }
                    /* keep this column in the output file */
                    savecol = 1;
                    if (!colindex)
                       colindex = (int *) calloc(999, sizeof(int));

                    colindex[colnum - 1] = 1;  /* flag this column number */
                }
                else
                {
                    /* try renaming a keyword */
		    ffcmsg();   /* clear error message stack */
                    *status = 0;
                    if (ffmnam(*fptr, oldname, colname, status) > 0)
                    {
                      ffpmsg("column or keyword to be renamed does not exist:");
                        ffpmsg(clause);
                        if( colindex ) free( colindex );
                        if( file_expr ) free( file_expr );
			if (clause) free(clause);
                        return(*status);
                    }
                }
              }  
              else
              {
                /*...................................................... */
                /* Case B: */
                /* this must be a general column/keyword calc expression */
                /* "name = expression" or "colname(TFORM) = expression" */
                /*...................................................... */

                /* parse the name and TFORM values, if present */
                colformat[0] = '\0';
                cptr3 = colname;

                if (fits_get_token2(&cptr3, "(", &tstbuff, NULL, status)==0)
                {
                   oldname[0]=0;
                }
                else
                {
                   if (strlen(tstbuff) > FLEN_VALUE-1)
                   {
                         ffpmsg("column expression is too long (ffedit_columns)");
                         if( colindex ) free( colindex );
                         if( file_expr ) free( file_expr );
		         if (clause) free(clause);
                         free(tstbuff);
                         *status=URL_PARSE_ERROR;
                         return(*status);
                   }
                   strcpy(oldname, tstbuff);
                   free(tstbuff);
                   tstbuff=0;
                }
                if (cptr3[0] == '(' )
                {
                   cptr3++;  /* skip the '(' */
                   if (fits_get_token2(&cptr3, ")", &tstbuff, NULL, status)==0)
                   {
                      colformat[0]=0;
                   }
                   else
                   {
                      if (strlen(tstbuff) > FLEN_VALUE-1)
                      {
                            ffpmsg("column expression is too long (ffedit_columns)");
                            if( colindex ) free( colindex );
                            if( file_expr ) free( file_expr );
		            if (clause) free(clause);
                            free(tstbuff);
                            *status=URL_PARSE_ERROR;
                            return(*status);
                      }
                      strcpy(colformat, tstbuff);
                      free(tstbuff);
                      tstbuff=0;
                   }
                }

                /* calculate values for the column or keyword */
                /*   cptr2 = the expression to be calculated */
                /*   oldname = name of the column or keyword */
                /*   colformat = column format, or keyword comment string */
                if (fits_calculator(*fptr, cptr2, *fptr, oldname, colformat,
       	                        status) > 0) {
				
                        ffpmsg("Unable to calculate expression");
                        if( colindex ) free( colindex );
                        if( file_expr ) free( file_expr );
			if (clause) free(clause);
                         return(*status);
                }

                /* test if this is a column and not a keyword */
                tstatus = 0;
                ffgcno(*fptr, CASEINSEN, oldname, &testnum, &tstatus);
                if (tstatus == 0)
                {
                    /* keep this column in the output file */
		    colnum = testnum;
                    savecol = 1;

                    if (!colindex)
                      colindex = (int *) calloc(999, sizeof(int));

                    colindex[colnum - 1] = 1;
                    if (colnum > numcols)numcols++;
                }
		else
		{
		   ffcmsg();  /* clear the error message stack */
		}
              }
            }
        }
	if (clause) free(clause);  /* free old clause before getting new one */
        clause = NULL;
    }

    if (savecol && !deletecol)
    {
       /* need to delete all but the specified columns */
       for (ii = numcols; ii > 0; ii--)
       {
         if (!colindex[ii-1])  /* delete this column */
         {
           if (ffdcol(*fptr, ii, status) > 0)
           {
             ffpmsg("failed to delete column in input file:");
             ffpmsg(clause);
             if( colindex ) free( colindex );
             if( file_expr ) free( file_expr );
	     if (clause) free(clause);
             return(*status);
           }
         }
       }
    }

    if( colindex ) free( colindex );
    if( file_expr ) free( file_expr );
    if (clause) free(clause);

    return(*status);
}